

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_context_open_client__jack(ma_context *pContext,ma_jack_client_t **ppClient)

{
  char *pcVar1;
  uint uVar2;
  uint uVar3;
  ma_jack_client_t *pmVar4;
  char *src;
  ma_result mVar5;
  ma_jack_status_t status;
  char clientName [256];
  
  if (ppClient != (ma_jack_client_t **)0x0) {
    *ppClient = (ma_jack_client_t *)0x0;
    uVar3 = (*(pContext->field_21).alsa.snd_pcm_hw_params_sizeof)();
    uVar2 = 0x100;
    if (uVar3 < 0x100) {
      uVar2 = uVar3;
    }
    pcVar1 = (pContext->field_21).jack.pClientName;
    src = "miniaudio";
    if (pcVar1 != (char *)0x0) {
      src = pcVar1;
    }
    ma_strncpy_s(clientName,(ulong)uVar2,src,0xffffffffffffffff);
    mVar5 = 0;
    pmVar4 = (ma_jack_client_t *)
             (*(pContext->field_21).alsa.snd_pcm_open)
                       (clientName,(ulong)((pContext->field_21).jack.tryStartServer == 0),&status,0)
    ;
    if (pmVar4 == (ma_jack_client_t *)0x0) {
      mVar5 = -0x12d;
    }
    else {
      *ppClient = pmVar4;
    }
    return mVar5;
  }
  __assert_fail("ppClient != __null",
                "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                ,0x509a,"ma_result ma_context_open_client__jack(ma_context *, ma_jack_client_t **)")
  ;
}

Assistant:

static ma_result ma_context_open_client__jack(ma_context* pContext, ma_jack_client_t** ppClient)
{
    size_t maxClientNameSize;
    char clientName[256];
    ma_jack_status_t status;
    ma_jack_client_t* pClient;

    MA_ASSERT(pContext != NULL);
    MA_ASSERT(ppClient != NULL);

    if (ppClient) {
        *ppClient = NULL;
    }

    maxClientNameSize = ((ma_jack_client_name_size_proc)pContext->jack.jack_client_name_size)(); /* Includes null terminator. */
    ma_strncpy_s(clientName, ma_min(sizeof(clientName), maxClientNameSize), (pContext->jack.pClientName != NULL) ? pContext->jack.pClientName : "miniaudio", (size_t)-1);

    pClient = ((ma_jack_client_open_proc)pContext->jack.jack_client_open)(clientName, (pContext->jack.tryStartServer) ? 0 : ma_JackNoStartServer, &status, NULL);
    if (pClient == NULL) {
        return MA_FAILED_TO_OPEN_BACKEND_DEVICE;
    }

    if (ppClient) {
        *ppClient = pClient;
    }

    return MA_SUCCESS;
}